

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall
Catch::BinaryExpr<const_frozen::basic_string<wchar_t>_&,_const_frozen::basic_string<wchar_t>_&>::
streamReconstructedExpression
          (BinaryExpr<const_frozen::basic_string<wchar_t>_&,_const_frozen::basic_string<wchar_t>_&>
           *this,ostream *os)

{
  Detail *pDVar1;
  string *lhs;
  char *pcVar2;
  wchar_t *in_RCX;
  string *in_R9;
  StringRef op;
  string local_60;
  string local_40;
  
  pDVar1 = (Detail *)this->m_lhs->data_;
  Detail::rangeToString<wchar_t_const*,wchar_t_const*>
            (&local_40,pDVar1,(wchar_t *)(pDVar1 + this->m_lhs->size_ * 4),in_RCX);
  lhs = (string *)(this->m_op).m_start;
  pcVar2 = (char *)(this->m_op).m_size;
  pDVar1 = (Detail *)this->m_rhs->data_;
  Detail::rangeToString<wchar_t_const*,wchar_t_const*>
            (&local_60,pDVar1,(wchar_t *)(pDVar1 + this->m_rhs->size_ * 4),in_RCX);
  op.m_size = (size_type)&local_60;
  op.m_start = pcVar2;
  formatReconstructedExpression((Catch *)os,(ostream *)&local_40,lhs,op,in_R9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void streamReconstructedExpression( std::ostream &os ) const override {
            formatReconstructedExpression
                    ( os, Catch::Detail::stringify( m_lhs ), m_op, Catch::Detail::stringify( m_rhs ) );
        }